

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O3

void __thiscall
TPZAutoPointer<TPZDohrAssembly<double>_>::~TPZAutoPointer
          (TPZAutoPointer<TPZDohrAssembly<double>_> *this)

{
  TPZReference *pTVar1;
  bool bVar2;
  
  if (this->fRef != (TPZReference *)0x0) {
    bVar2 = TPZReference::Decrease(this->fRef);
    if (bVar2) {
      if ((this->fRef != (TPZReference *)0x0) &&
         ((this->fRef->fCounter).super___atomic_base<int>._M_i == 0)) {
        pTVar1 = this->fRef;
        if ((pTVar1 != (TPZReference *)0x0) && (pTVar1->fPointer != (TPZDohrAssembly<double> *)0x0))
        {
          (*(pTVar1->fPointer->super_TPZSavable)._vptr_TPZSavable[1])();
        }
        operator_delete(pTVar1,0x10);
      }
      this->fRef = (TPZReference *)0x0;
    }
  }
  return;
}

Assistant:

~TPZAutoPointer()
	{        
        if (fRef && fRef->Decrease()){
            Release();
        }
	}